

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_field.h
# Opt level: O0

void __thiscall
google::protobuf::internal::RepeatedPtrFieldBase::
SwapFallback<google::protobuf::internal::GenericTypeHandler<google::protobuf::Message>>
          (RepeatedPtrFieldBase *this,RepeatedPtrFieldBase *other)

{
  Arena *arena;
  RepeatedPtrFieldBase *in_RSI;
  RepeatedPtrFieldBase *in_stack_00000018;
  RepeatedPtrFieldBase *in_stack_00000020;
  RepeatedPtrFieldBase temp;
  RepeatedPtrFieldBase *in_stack_ffffffffffffff70;
  RepeatedPtrFieldBase local_78 [2];
  RepeatedPtrFieldBase *in_stack_ffffffffffffffc8;
  RepeatedPtrFieldBase *in_stack_ffffffffffffffd0;
  
  arena = GetArenaNoVirtual(in_RSI);
  RepeatedPtrFieldBase(local_78,arena);
  MergeFrom<google::protobuf::internal::GenericTypeHandler<google::protobuf::Message>>
            (in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
  Clear<google::protobuf::internal::GenericTypeHandler<google::protobuf::Message>>
            (in_stack_ffffffffffffffd0);
  MergeFrom<google::protobuf::internal::GenericTypeHandler<google::protobuf::Message>>
            (in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
  Clear<google::protobuf::internal::GenericTypeHandler<google::protobuf::Message>>
            (in_stack_ffffffffffffffd0);
  InternalSwap(in_stack_00000020,in_stack_00000018);
  Destroy<google::protobuf::internal::GenericTypeHandler<google::protobuf::Message>>
            (in_stack_ffffffffffffff70);
  ~RepeatedPtrFieldBase(local_78);
  return;
}

Assistant:

void RepeatedPtrFieldBase::SwapFallback(RepeatedPtrFieldBase* other) {
  GOOGLE_DCHECK(other->GetArenaNoVirtual() != GetArenaNoVirtual());

  // Copy semantics in this case. We try to improve efficiency by placing the
  // temporary on |other|'s arena so that messages are copied cross-arena only
  // once, not twice.
  RepeatedPtrFieldBase temp(other->GetArenaNoVirtual());
  temp.MergeFrom<TypeHandler>(*this);
  this->Clear<TypeHandler>();
  this->MergeFrom<TypeHandler>(*other);
  other->Clear<TypeHandler>();
  other->InternalSwap(&temp);
  temp.Destroy<TypeHandler>();  // Frees rep_ if `other` had no arena.
}